

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O1

VarId __thiscall optimization::loop_unrolling::Rewriter::copy_var(Rewriter *this,VarId *var)

{
  VarId *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  long lVar3;
  mapped_type *pmVar4;
  key_type *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  uint32_t uVar6;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_bool> pVar7;
  VarId VVar8;
  uint32_t local_5c;
  undefined **local_58;
  undefined **local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_38;
  
  this_00 = var + 1;
  sVar1 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)this_00,in_RDX);
  if (sVar1 == 0) {
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((var->super_Displayable)._vptr_Displayable + 8));
    uVar6 = *(int *)(lVar3 + 0x20) + 1;
    this->func = (MirFunction *)&PTR_display_001ee058;
    *(uint32_t *)&this->blk = uVar6;
    local_58 = &PTR_display_001ee058;
    local_50 = (undefined **)CONCAT44(local_50._4_4_,in_RDX->id);
    local_48 = (element_type *)&PTR_display_001ee058;
    local_40._M_pi._0_4_ = uVar6;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,mir::inst::VarId>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
                *)this_00,(pair<const_mir::inst::VarId,_mir::inst::VarId> *)&local_58);
    this_01 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
               *)((var->super_Displayable)._vptr_Displayable + 7);
    local_5c = in_RDX->id;
    pmVar4 = std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)this_01,&local_5c);
    local_58 = (undefined **)CONCAT44(local_58._4_4_,uVar6);
    local_50 = &PTR_display_001eff98;
    local_48 = (pmVar4->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40._M_pi =
         (pmVar4->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      }
    }
    local_38._0_1_ = pmVar4->is_memory_var;
    local_38._1_1_ = pmVar4->is_temp_var;
    local_38._2_1_ = pmVar4->is_phi_var;
    local_38._3_1_ = pmVar4->field_0x1b;
    local_38._4_4_ = pmVar4->priority;
    pVar7 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
            ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>
                      (this_01,(pair<const_unsigned_int,_mir::inst::Variable> *)&local_58);
    uVar5 = pVar7._8_8_;
    local_50 = &PTR_display_001eff98;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      uVar5 = extraout_RDX_00;
    }
  }
  else {
    pmVar2 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)this_00,in_RDX);
    this->func = (MirFunction *)&PTR_display_001ee058;
    *(uint32_t *)&this->blk = pmVar2->id;
    uVar5 = extraout_RDX;
  }
  VVar8._8_8_ = uVar5;
  VVar8.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar8;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    if (var_map.count(var)) {
      return var_map.at(var);
    }
    auto id = get_new_VarId();
    var_map.insert({var, id});
    func.variables.insert({id, func.variables.at(var)});
    return id;
  }